

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O2

bool findFiles(string *path,string *fileMask,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *fileList,bool savePaths)

{
  uint uVar1;
  int iVar2;
  dirent64 *__ptr;
  ulong uVar3;
  bool bVar4;
  dirent **namelist;
  string fileName;
  dirent64 **local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = path;
  uVar1 = scandir64((path->_M_dataplus)._M_p,&local_80,(__selector *)0x0,(__cmp *)0x0);
  if (-1 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
    while( true ) {
      bVar4 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar4) break;
      __ptr = local_80[uVar3];
      if (__ptr->d_type == '\b') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,__ptr->d_name,(allocator<char> *)&local_50);
        iVar2 = fnmatch((fileMask->_M_dataplus)._M_p,local_70._M_dataplus._M_p,0);
        if (iVar2 == 0) {
          if (savePaths) {
            std::operator+(&local_50,local_78,&local_70);
          }
          else {
            std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)fileList,
                     &local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__cxx11::string::~string((string *)&local_70);
        __ptr = local_80[uVar3];
      }
      free(__ptr);
    }
    free(local_80);
  }
  return -1 < (int)uVar1;
}

Assistant:

bool findFiles(const string& path, const string& fileMask, vector<string>* fileList, bool savePaths)
{
    dirent** namelist;

    int n = scandir(path.c_str(), &namelist, 0, 0);  // alphasort);

    if (n < 0)
    {
        return false;
    }
    else
    {
        while (n--)
        {
            if (namelist[n]->d_type == DT_REG)
            {
                string fileName(namelist[n]->d_name);

                if (0 == fnmatch(fileMask.c_str(), fileName.c_str(), 0))
                    fileList->push_back(savePaths ? path + fileName : fileName);
            }
            free(namelist[n]);
        }
        free(namelist);
    }

    return true;
}